

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureFilteringTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles3::Functional::Texture2DArrayFilteringCase::iterate(Texture2DArrayFilteringCase *this)

{
  undefined8 uVar1;
  TestLog *log;
  RenderContext *context;
  pointer pFVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  int iVar6;
  deUint32 dVar7;
  deUint32 dVar8;
  undefined4 extraout_EAX;
  uint uVar9;
  undefined4 extraout_var;
  RenderTarget *pRVar11;
  NotSupportedError *this_00;
  byte bVar12;
  char *description;
  pointer pFVar13;
  qpTestResult testResult;
  TestContext *pTVar14;
  long lVar15;
  float fVar16;
  float fVar17;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  RandomViewport viewport;
  LodPrecision lodPrecision;
  undefined1 local_3a8 [8];
  float local_3a0;
  float local_39c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_398;
  float local_388;
  undefined8 local_384;
  float local_37c;
  Texture2DArrayView local_370;
  ScopedLogSection section;
  undefined1 local_358 [32];
  _func_int **pp_Stack_338;
  BVec4 local_330;
  Surface rendered;
  PixelFormat pixelFormat;
  TextureFormat texFmt;
  IVec4 colorBits;
  float local_298;
  float fStack_294;
  undefined1 local_288 [76];
  _func_int **pp_Stack_23c;
  size_type local_234;
  bool bStack_22c;
  undefined3 uStack_22b;
  CompareMode CStack_228;
  int local_224;
  anon_union_16_3_1194ccdc_for_v local_220;
  undefined8 local_210;
  LodMode local_208;
  undefined1 local_1f0 [8];
  _func_int **pp_Stack_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0;
  int local_1d0;
  anon_union_16_3_1194ccdc_for_v local_1cc [21];
  TextureFormatInfo fmtInfo;
  long lVar10;
  
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar10 = CONCAT44(extraout_var,iVar6);
  pRVar11 = Context::getRenderTarget((this->super_TestCase).m_context);
  dVar7 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  dVar8 = ::deInt32Hash(this->m_caseNdx);
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&viewport,pRVar11,0x40,0x40,dVar7 ^ dVar8);
  iVar6 = this->m_caseNdx;
  pFVar13 = (this->m_cases).
            super__Vector_base<deqp::gles3::Functional::Texture2DArrayFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::Texture2DArrayFilteringCase::FilterCase>_>
            ._M_impl.super__Vector_impl_data._M_start;
  texFmt = ((pFVar13[iVar6].texture)->m_refTexture).super_TextureLevelPyramid.m_format;
  tcu::getTextureFormatInfo(&fmtInfo,&texFmt);
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_288,"Test",(allocator<char> *)&colorBits);
  de::toString<int>((string *)local_3a8,&this->m_caseNdx);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&rendered,"Test ",(allocator<char> *)&local_370);
  de::toString<int>((string *)&pixelFormat,&this->m_caseNdx);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rendered,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pixelFormat);
  tcu::ScopedLogSection::ScopedLogSection(&section,log,(string *)local_1f0,(string *)local_358);
  std::__cxx11::string::~string((string *)local_358);
  std::__cxx11::string::~string((string *)&pixelFormat);
  std::__cxx11::string::~string((string *)&rendered);
  std::__cxx11::string::~string((string *)local_1f0);
  std::__cxx11::string::~string((string *)local_3a8);
  std::__cxx11::string::~string((string *)local_288);
  testResult = QP_TEST_RESULT_QUALITY_WARNING;
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            ((ReferenceParams *)local_288,TEXTURETYPE_2D_ARRAY);
  tcu::Surface::Surface(&rendered,viewport.width,viewport.height);
  pFVar13 = pFVar13 + iVar6;
  lVar15 = 0;
  do {
    tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(local_3a8 + lVar15));
    lVar15 = lVar15 + 0xc;
  } while (lVar15 != 0x30);
  if ((viewport.width < 0x40) || (viewport.height < 0x40)) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Too small render target",glcts::fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureFilteringTests.cpp"
               ,0x347);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  glu::mapGLSampler((Sampler *)local_1f0,this->m_wrapS,this->m_wrapT,this->m_wrapT,this->m_minFilter
                    ,this->m_magFilter);
  local_224 = local_1d0;
  local_234 = local_1e0._M_allocated_capacity;
  bStack_22c = (bool)local_1e0._M_local_buf[8];
  uStack_22b = local_1e0._9_3_;
  CStack_228 = local_1e0._12_4_;
  local_288._68_8_ = local_1f0;
  pp_Stack_23c = pp_Stack_1e8;
  local_220._0_8_ = local_1cc[0]._0_8_;
  local_220._8_8_ = local_1cc[0]._8_8_;
  local_210 = local_1cc[1]._0_8_;
  local_288._4_4_ = glu::TextureTestUtil::getSamplerType(texFmt);
  local_208 = LODMODE_EXACT;
  local_288._52_4_ = fmtInfo.lookupBias.m_data[0];
  local_288._56_4_ = fmtInfo.lookupBias.m_data[1];
  local_288._60_4_ = fmtInfo.lookupBias.m_data[2];
  local_288._64_4_ = fmtInfo.lookupBias.m_data[3];
  local_288._36_4_ = fmtInfo.lookupScale.m_data[0];
  local_288._40_4_ = fmtInfo.lookupScale.m_data[1];
  local_288._44_4_ = fmtInfo.lookupScale.m_data[2];
  local_288._48_4_ = fmtInfo.lookupScale.m_data[3];
  local_1f0 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1e8);
  std::operator<<((ostream *)&pp_Stack_1e8,"Approximate lod per axis = ");
  tcu::operator<<((ostream *)&pp_Stack_1e8,&pFVar13->lod);
  std::operator<<((ostream *)&pp_Stack_1e8,", offset = ");
  tcu::operator<<((ostream *)&pp_Stack_1e8,&pFVar13->offset);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1f0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1e8);
  fVar17 = (pFVar13->lod).m_data[1];
  uVar1 = *(undefined8 *)(pFVar13->offset).m_data;
  fVar16 = deFloatExp2((pFVar13->lod).m_data[0]);
  iVar4 = viewport.height;
  iVar3 = viewport.width;
  iVar6 = (this->m_gradientTex->m_refTexture).m_width;
  fVar17 = deFloatExp2(fVar17);
  auVar19._0_4_ = fVar16 * (float)iVar3;
  auVar19._4_4_ = fVar17 * (float)viewport.height;
  auVar19._8_4_ = extraout_XMM0_Db * (float)iVar3;
  auVar19._12_4_ = extraout_XMM0_Db_00 * (float)iVar4;
  auVar20._0_4_ = (float)iVar6;
  auVar20._4_4_ = (float)(this->m_gradientTex->m_refTexture).m_height;
  auVar20._8_8_ = 0;
  auVar20 = divps(auVar19,auVar20);
  local_3a0 = (pFVar13->layerRange).m_data[0];
  local_37c = (pFVar13->layerRange).m_data[1];
  local_298 = (float)uVar1;
  fStack_294 = (float)((ulong)uVar1 >> 0x20);
  local_3a8._0_4_ = local_298;
  local_3a8._4_4_ = fStack_294;
  local_398._M_allocated_capacity._4_4_ = local_3a0 * 0.5 + local_37c * 0.5;
  local_39c = local_298;
  local_398._8_4_ = auVar20._0_4_ + local_298;
  local_398._M_allocated_capacity._0_4_ = auVar20._4_4_ + fStack_294;
  local_384 = CONCAT44(local_398._M_allocated_capacity._0_4_,local_398._8_4_);
  local_398._12_4_ = fStack_294;
  local_388 = (float)local_398._M_allocated_capacity._4_4_;
  (**(code **)(lVar10 + 0xb8))(0x8c1a,pFVar13->texture->m_glTexture);
  (**(code **)(lVar10 + 0x1360))(0x8c1a,0x2801,this->m_minFilter);
  (**(code **)(lVar10 + 0x1360))(0x8c1a,0x2800,this->m_magFilter);
  (**(code **)(lVar10 + 0x1360))(0x8c1a,0x2802,this->m_wrapS);
  (**(code **)(lVar10 + 0x1360))(0x8c1a,0x2803,this->m_wrapT);
  (**(code **)(lVar10 + 0x1a00))(viewport.x,viewport.y,viewport.width,viewport.height);
  deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
            (&this->m_renderer,0,(float *)local_3a8,(RenderParams *)local_288);
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  tcu::Surface::getAccess((PixelBufferAccess *)local_1f0,&rendered);
  glu::readPixels(context,viewport.x,viewport.y,(PixelBufferAccess *)local_1f0);
  dVar7 = this->m_minFilter;
  dVar8 = this->m_magFilter;
  pRVar11 = Context::getRenderTarget((this->super_TestCase).m_context);
  local_358._0_8_ = *(undefined8 *)&pRVar11->m_pixelFormat;
  pixelFormat.blueBits = (pRVar11->m_pixelFormat).blueBits;
  pixelFormat.alphaBits = (pRVar11->m_pixelFormat).alphaBits;
  local_358._8_4_ = pixelFormat.blueBits;
  local_358._12_4_ = pixelFormat.alphaBits;
  pixelFormat._0_8_ = local_358._0_8_;
  tcu::operator-((tcu *)local_1f0,(Vector<int,_4> *)local_358,
                 (dVar8 != 0x2600 || dVar7 != 0x2600) + 1);
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&local_370,0);
  tcu::max<int,4>((tcu *)&colorBits,(Vector<int,_4> *)local_1f0,(Vector<int,_4> *)&local_370);
  lodPrecision.rule = RULE_OPENGL;
  lodPrecision.derivateBits = 0x16;
  lodPrecision.lodBits = 0x10;
  tcu::LookupPrecision::LookupPrecision((LookupPrecision *)local_358);
  lodPrecision.derivateBits = 0x12;
  lodPrecision.lodBits = 6;
  tcu::computeFixedPointThreshold((tcu *)&local_370,&colorBits);
  tcu::operator/((tcu *)local_1f0,(Vector<float,_4> *)&local_370,
                 (Vector<float,_4> *)(local_288 + 0x24));
  local_358._24_8_ = local_1f0;
  pp_Stack_338 = pp_Stack_1e8;
  local_358._0_8_ = (pointer)0x1400000014;
  local_358._8_4_ = 0x14;
  local_358._12_4_ = 7;
  local_358._16_4_ = 7;
  local_358._20_4_ = 0;
  auVar18._0_4_ = -(uint)(0 < pixelFormat.redBits);
  auVar18._4_4_ = -(uint)(0 < pixelFormat.greenBits);
  auVar18._8_4_ = -(uint)(0 < pixelFormat.blueBits);
  auVar18._12_4_ = -(uint)(0 < pixelFormat.alphaBits);
  uVar9 = movmskps(extraout_EAX,auVar18);
  bVar12 = (byte)uVar9;
  local_330.m_data =
       (bool  [4])
       (uVar9 & 1 | (uint)((bVar12 & 2) >> 1) << 8 | (uint)((bVar12 & 4) >> 2) << 0x10 |
       (uint)(bVar12 >> 3) << 0x18);
  pTVar14 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
  tcu::Surface::getAccess((PixelBufferAccess *)local_1f0,&rendered);
  local_370.m_numLevels = (pFVar13->texture->m_refTexture).m_view.m_numLevels;
  local_370.m_levels = (pFVar13->texture->m_refTexture).m_view.m_levels;
  bVar5 = glu::TextureTestUtil::verifyTextureResult
                    (pTVar14,(ConstPixelBufferAccess *)local_1f0,&local_370,(float *)local_3a8,
                     (ReferenceParams *)local_288,(LookupPrecision *)local_358,&lodPrecision,
                     &pixelFormat);
  if (!bVar5) {
    lodPrecision.lodBits = 4;
    local_358._12_4_ = 4;
    local_358._16_4_ = 4;
    local_358._20_4_ = 0;
    local_1f0 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1e8);
    std::operator<<((ostream *)&pp_Stack_1e8,
                    "Warning: Verification against high precision requirements failed, trying with lower requirements."
                   );
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1f0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1e8);
    pTVar14 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    tcu::Surface::getAccess((PixelBufferAccess *)local_1f0,&rendered);
    local_370.m_numLevels = (pFVar13->texture->m_refTexture).m_view.m_numLevels;
    local_370.m_levels = (pFVar13->texture->m_refTexture).m_view.m_levels;
    bVar5 = glu::TextureTestUtil::verifyTextureResult
                      (pTVar14,(ConstPixelBufferAccess *)local_1f0,&local_370,(float *)local_3a8,
                       (ReferenceParams *)local_288,(LookupPrecision *)local_358,&lodPrecision,
                       &pixelFormat);
    if (bVar5) {
      pTVar14 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      if (pTVar14->m_testResult != QP_TEST_RESULT_PASS) goto LAB_0100495e;
      description = "Low-quality filtering result";
    }
    else {
      local_1f0 = (undefined1  [8])
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1e8);
      std::operator<<((ostream *)&pp_Stack_1e8,
                      "ERROR: Verification against low precision requirements failed, failing test case."
                     );
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1f0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1e8);
      pTVar14 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      description = "Image verification failed";
      testResult = QP_TEST_RESULT_FAIL;
    }
    tcu::TestContext::setTestResult(pTVar14,testResult,description);
  }
LAB_0100495e:
  iVar6 = this->m_caseNdx + 1;
  this->m_caseNdx = iVar6;
  pFVar13 = (this->m_cases).
            super__Vector_base<deqp::gles3::Functional::Texture2DArrayFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::Texture2DArrayFilteringCase::FilterCase>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pFVar2 = (this->m_cases).
           super__Vector_base<deqp::gles3::Functional::Texture2DArrayFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::Texture2DArrayFilteringCase::FilterCase>_>
           ._M_impl.super__Vector_impl_data._M_start;
  tcu::Surface::~Surface(&rendered);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  return (IterateResult)(iVar6 < (int)((ulong)((long)pFVar13 - (long)pFVar2) >> 5));
}

Assistant:

Texture2DArrayFilteringCase::IterateResult Texture2DArrayFilteringCase::iterate (void)
{
	const glw::Functions&			gl			= m_context.getRenderContext().getFunctions();
	const RandomViewport			viewport	(m_context.getRenderTarget(), TEX3D_VIEWPORT_WIDTH, TEX3D_VIEWPORT_HEIGHT, deStringHash(getName()) ^ deInt32Hash(m_caseNdx));
	const FilterCase&				curCase		= m_cases[m_caseNdx];
	const tcu::TextureFormat		texFmt		= curCase.texture->getRefTexture().getFormat();
	const tcu::TextureFormatInfo	fmtInfo		= tcu::getTextureFormatInfo(texFmt);
	const tcu::ScopedLogSection		section		(m_testCtx.getLog(), string("Test") + de::toString(m_caseNdx), string("Test ") + de::toString(m_caseNdx));
	ReferenceParams					refParams	(TEXTURETYPE_2D_ARRAY);
	tcu::Surface					rendered	(viewport.width, viewport.height);
	tcu::Vec3						texCoord[4];

	if (viewport.width < TEX3D_MIN_VIEWPORT_WIDTH || viewport.height < TEX3D_MIN_VIEWPORT_HEIGHT)
		throw tcu::NotSupportedError("Too small render target", "", __FILE__, __LINE__);

	// Setup params for reference.
	refParams.sampler		= glu::mapGLSampler(m_wrapS, m_wrapT, m_wrapT, m_minFilter, m_magFilter);
	refParams.samplerType	= getSamplerType(texFmt);
	refParams.lodMode		= LODMODE_EXACT;
	refParams.colorBias		= fmtInfo.lookupBias;
	refParams.colorScale	= fmtInfo.lookupScale;

	// Compute texture coordinates.
	m_testCtx.getLog() << TestLog::Message << "Approximate lod per axis = " << curCase.lod << ", offset = " << curCase.offset << TestLog::EndMessage;

	{
		const float	lodX	= curCase.lod.x();
		const float	lodY	= curCase.lod.y();
		const float	oX		= curCase.offset.x();
		const float	oY		= curCase.offset.y();
		const float	sX		= deFloatExp2(lodX)*float(viewport.width)	/ float(m_gradientTex->getRefTexture().getWidth());
		const float	sY		= deFloatExp2(lodY)*float(viewport.height)	/ float(m_gradientTex->getRefTexture().getHeight());
		const float	l0		= curCase.layerRange.x();
		const float	l1		= curCase.layerRange.y();

		texCoord[0] = tcu::Vec3(oX,		oY,		l0);
		texCoord[1] = tcu::Vec3(oX,		oY+sY,	l0*0.5f + l1*0.5f);
		texCoord[2] = tcu::Vec3(oX+sX,	oY,		l0*0.5f + l1*0.5f);
		texCoord[3] = tcu::Vec3(oX+sX,	oY+sY,	l1);
	}

	gl.bindTexture	(GL_TEXTURE_2D_ARRAY, curCase.texture->getGLTexture());
	gl.texParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MIN_FILTER,	m_minFilter);
	gl.texParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MAG_FILTER,	m_magFilter);
	gl.texParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_WRAP_S,		m_wrapS);
	gl.texParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_WRAP_T,		m_wrapT);

	gl.viewport(viewport.x, viewport.y, viewport.width, viewport.height);
	m_renderer.renderQuad(0, (const float*)&texCoord[0], refParams);
	glu::readPixels(m_context.getRenderContext(), viewport.x, viewport.y, rendered.getAccess());

	{
		const bool				isNearestOnly	= m_minFilter == GL_NEAREST && m_magFilter == GL_NEAREST;
		const tcu::PixelFormat	pixelFormat		= m_context.getRenderTarget().getPixelFormat();
		const tcu::IVec4		colorBits		= max(getBitsVec(pixelFormat) - (isNearestOnly ? 1 : 2), tcu::IVec4(0)); // 1 inaccurate bit if nearest only, 2 otherwise
		tcu::LodPrecision		lodPrecision	(tcu::LodPrecision::RULE_OPENGL);
		tcu::LookupPrecision	lookupPrecision;

		lodPrecision.derivateBits		= 18;
		lodPrecision.lodBits			= 6;
		lookupPrecision.colorThreshold	= tcu::computeFixedPointThreshold(colorBits) / refParams.colorScale;
		lookupPrecision.coordBits		= tcu::IVec3(20,20,20);
		lookupPrecision.uvwBits			= tcu::IVec3(7,7,0);
		lookupPrecision.colorMask		= getCompareMask(pixelFormat);

		const bool isHighQuality = verifyTextureResult(m_testCtx, rendered.getAccess(), curCase.texture->getRefTexture(),
													   (const float*)&texCoord[0], refParams, lookupPrecision, lodPrecision, pixelFormat);

		if (!isHighQuality)
		{
			// Evaluate against lower precision requirements.
			lodPrecision.lodBits	= 4;
			lookupPrecision.uvwBits	= tcu::IVec3(4,4,0);

			m_testCtx.getLog() << TestLog::Message << "Warning: Verification against high precision requirements failed, trying with lower requirements." << TestLog::EndMessage;

			const bool isOk = verifyTextureResult(m_testCtx, rendered.getAccess(), curCase.texture->getRefTexture(),
												  (const float*)&texCoord[0], refParams, lookupPrecision, lodPrecision, pixelFormat);

			if (!isOk)
			{
				m_testCtx.getLog() << TestLog::Message << "ERROR: Verification against low precision requirements failed, failing test case." << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image verification failed");
			}
			else if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
				m_testCtx.setTestResult(QP_TEST_RESULT_QUALITY_WARNING, "Low-quality filtering result");
		}
	}

	m_caseNdx += 1;
	return m_caseNdx < (int)m_cases.size() ? CONTINUE : STOP;
}